

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

void __thiscall
deqp::gls::BuiltinPrecisionTests::PrecisionCase::
testStatement<deqp::gls::BuiltinPrecisionTests::InTypes<float,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>,deqp::gls::BuiltinPrecisionTests::OutTypes<float,int>>
          (PrecisionCase *this,
          Variables<deqp::gls::BuiltinPrecisionTests::InTypes<float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<float,_int>_>
          *variables,
          Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *inputs,Statement *stmt)

{
  float fVar1;
  pointer pfVar2;
  pointer pfVar3;
  Variable<float> *pVVar4;
  pointer pcVar5;
  Variable<int> *pVVar6;
  _func_int **pp_Var7;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<float,_int>_>
  *pVVar8;
  bool bVar9;
  bool bVar10;
  ContextType type;
  int iVar11;
  undefined8 uVar12;
  char *pcVar13;
  size_t sVar14;
  long *plVar15;
  ShaderExecutor *pSVar16;
  IVal *pIVar17;
  IVal *x;
  TestError *this_00;
  uint uVar18;
  TestLog *pTVar19;
  ulong uVar20;
  IVal IVar21;
  long lVar22;
  PrecisionCase *pPVar23;
  double dVar24;
  double dVar25;
  IVal in1;
  FuncSet funcs;
  IVal in2;
  IVal in3;
  ostringstream os;
  FloatFormat highpFmt;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<float,_int>_> outputs;
  Environment env;
  ostringstream oss;
  ShaderSpec spec;
  PrecisionCase *local_528;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<float,_int>_>
  *local_520;
  string local_518;
  undefined1 local_4f8 [8];
  undefined8 local_4f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4e8;
  _Rb_tree_node_base *local_4d8;
  size_t local_4d0;
  Statement *local_4c8;
  ulong local_4c0;
  Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_4b8;
  FloatFormat *local_4b0;
  IVal local_4a8;
  IVal local_488;
  ulong local_468;
  ResultCollector *local_460;
  undefined1 local_458 [8];
  undefined1 auStack_450 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_448;
  double local_438;
  Data local_430;
  undefined4 local_420;
  ios_base local_3e8 [8];
  ios_base local_3e0 [264];
  FloatFormat local_2d8;
  ulong local_2b0;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<float,_int>_> local_2a8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248 [3];
  ios_base local_1d8 [264];
  undefined1 local_d0 [56];
  _Alloc_hider local_98;
  size_type local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  _Alloc_hider local_78;
  size_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  double local_58;
  undefined8 uStack_50;
  _func_int **local_48;
  undefined8 uStack_40;
  
  pfVar2 = (inputs->in0).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  pfVar3 = (inputs->in0).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar20 = (long)pfVar3 - (long)pfVar2 >> 2;
  local_520 = variables;
  local_4c8 = stmt;
  local_4b8 = inputs;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<float,_int>_>::Outputs(&local_2a8,uVar20);
  local_98._M_p = (pointer)&local_88;
  local_d0._0_4_ = GLSL_VERSION_300_ES;
  local_d0._8_8_ = (pointer)0x0;
  local_d0._16_8_ = (pointer)0x0;
  local_d0._24_8_ = (pointer)0x0;
  local_d0._32_8_ = (pointer)0x0;
  local_d0._40_8_ = (pointer)0x0;
  local_d0._48_8_ = (pointer)0x0;
  local_90 = 0;
  local_88._M_local_buf[0] = '\0';
  local_78._M_p = (pointer)&local_68;
  local_70 = 0;
  local_68._M_local_buf[0] = '\0';
  local_2d8.m_maxValue = (this->m_ctx).highpFormat.m_maxValue;
  local_2d8.m_minExp = (this->m_ctx).highpFormat.m_minExp;
  local_2d8.m_maxExp = (this->m_ctx).highpFormat.m_maxExp;
  local_2d8.m_fractionBits = (this->m_ctx).highpFormat.m_fractionBits;
  local_2d8.m_hasSubnormal = (this->m_ctx).highpFormat.m_hasSubnormal;
  local_2d8.m_hasInf = (this->m_ctx).highpFormat.m_hasInf;
  local_2d8.m_hasNaN = (this->m_ctx).highpFormat.m_hasNaN;
  local_2d8.m_exactPrecision = (this->m_ctx).highpFormat.m_exactPrecision;
  local_2d8._25_7_ = *(undefined7 *)&(this->m_ctx).highpFormat.field_0x19;
  local_278._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_278._M_impl.super__Rb_tree_header._M_header;
  local_278._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_278._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_278._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_458 = (undefined1  [8])((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  local_528 = this;
  local_278._M_impl.super__Rb_tree_header._M_header._M_right =
       local_278._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_450);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_450,"Statement: ",0xb);
  (*local_4c8->_vptr_Statement[2])(local_4c8,(ostringstream *)auStack_450);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_458,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_450);
  std::ios_base::~ios_base(local_3e0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_248);
  local_4f0 = (double)((ulong)local_4f0._4_4_ << 0x20);
  local_4e8._M_allocated_capacity = 0;
  local_4d0 = 0;
  local_4e8._8_8_ = (_Rb_tree_node_base *)&local_4f0;
  local_4d8 = (_Rb_tree_node_base *)&local_4f0;
  (*local_4c8->_vptr_Statement[4])(local_4c8,local_4f8);
  if ((_Rb_tree_node_base *)local_4e8._8_8_ != (_Rb_tree_node_base *)&local_4f0) {
    uVar12 = local_4e8._8_8_;
    do {
      (**(code **)(**(long **)(uVar12 + 0x20) + 0x30))(*(long **)(uVar12 + 0x20),local_248);
      uVar12 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar12);
    } while ((_Rb_tree_node_base *)uVar12 != (_Rb_tree_node_base *)&local_4f0);
  }
  if (local_4d0 != 0) {
    local_458 = (undefined1  [8])((local_528->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_450);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)auStack_450,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)auStack_450,local_518._M_dataplus._M_p,local_518._M_string_length);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_458,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_518._M_dataplus._M_p != &local_518.field_2) {
      operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_450);
    std::ios_base::~ios_base(local_3e0);
  }
  std::
  _Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
               *)local_4f8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_248);
  std::ios_base::~ios_base(local_1d8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_458);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_458,"precision ",10);
  pcVar13 = glu::getPrecisionName((local_528->m_ctx).precision);
  if (pcVar13 == (char *)0x0) {
    std::ios::clear((int)((long)&local_528 + (long)((TestLog *)((long)local_458 + -0x18))->m_log) +
                    0xd0);
  }
  else {
    sVar14 = strlen(pcVar13);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_458,pcVar13,sVar14);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_458," float;\n",8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_98,(string *)local_248);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248[0]._M_dataplus._M_p != &local_248[0].field_2) {
    operator_delete(local_248[0]._M_dataplus._M_p,local_248[0].field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_458);
  std::ios_base::~ios_base(local_3e8);
  type.super_ApiType.m_bits =
       (ApiType)(*((local_528->m_ctx).renderContext)->_vptr_RenderContext[2])();
  local_d0._0_4_ = glu::getContextTypeGLSLVersion(type);
  if ((local_528->m_extension)._M_string_length != 0) {
    std::operator+(local_248,"#extension ",&local_528->m_extension);
    plVar15 = (long *)std::__cxx11::string::append((char *)local_248);
    pTVar19 = (TestLog *)(plVar15 + 2);
    if ((TestLog *)*plVar15 == pTVar19) {
      local_448._M_allocated_capacity = (size_type)pTVar19->m_log;
      local_448._8_8_ = plVar15[3];
      local_458 = (undefined1  [8])(auStack_450 + 8);
    }
    else {
      local_448._M_allocated_capacity = (size_type)pTVar19->m_log;
      local_458 = (undefined1  [8])*plVar15;
    }
    auStack_450 = (undefined1  [8])plVar15[1];
    *plVar15 = (long)pTVar19;
    plVar15[1] = 0;
    *(undefined1 *)(plVar15 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_98,(string *)local_458);
    if (local_458 != (undefined1  [8])(auStack_450 + 8)) {
      operator_delete((void *)local_458,(ulong)(local_448._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248[0]._M_dataplus._M_p != &local_248[0].field_2) {
      operator_delete(local_248[0]._M_dataplus._M_p,local_248[0].field_2._M_allocated_capacity + 1);
    }
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_d0 + 8),1);
  makeSymbol<float>((Symbol *)local_458,local_528,
                    (local_520->in0).
                    super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr)
  ;
  uVar12 = local_d0._8_8_;
  std::__cxx11::string::operator=((string *)local_d0._8_8_,(string *)local_458);
  glu::VarType::operator=((VarType *)(uVar12 + 0x20),(VarType *)&local_438);
  glu::VarType::~VarType((VarType *)&local_438);
  if (local_458 != (undefined1  [8])(auStack_450 + 8)) {
    operator_delete((void *)local_458,(ulong)(local_448._M_allocated_capacity + 1));
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_d0 + 0x20),2);
  makeSymbol<int>((Symbol *)local_458,local_528,
                  (local_520->out1).
                  super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<int>_>.m_ptr);
  uVar12 = local_d0._32_8_;
  std::__cxx11::string::operator=((string *)(local_d0._32_8_ + 0x38),(string *)local_458);
  glu::VarType::operator=(&((pointer)(uVar12 + 0x38))->varType,(VarType *)&local_438);
  glu::VarType::~VarType((VarType *)&local_438);
  if (local_458 != (undefined1  [8])(auStack_450 + 8)) {
    operator_delete((void *)local_458,(ulong)(local_448._M_allocated_capacity + 1));
  }
  makeSymbol<float>((Symbol *)local_458,local_528,
                    (local_520->out0).
                    super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr)
  ;
  uVar12 = local_d0._32_8_;
  std::__cxx11::string::operator=((string *)local_d0._32_8_,(string *)local_458);
  glu::VarType::operator=((VarType *)(uVar12 + 0x20),(VarType *)&local_438);
  glu::VarType::~VarType((VarType *)&local_438);
  if (local_458 != (undefined1  [8])(auStack_450 + 8)) {
    operator_delete((void *)local_458,(ulong)(local_448._M_allocated_capacity + 1));
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_458);
  (*local_4c8->_vptr_Statement[2])(local_4c8,local_458);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_458);
  std::ios_base::~ios_base(local_3e8);
  std::__cxx11::string::operator=((string *)&local_78,(string *)local_248);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248[0]._M_dataplus._M_p != &local_248[0].field_2) {
    operator_delete(local_248[0]._M_dataplus._M_p,local_248[0].field_2._M_allocated_capacity + 1);
  }
  pPVar23 = local_528;
  pSVar16 = ShaderExecUtil::createExecutor
                      ((local_528->m_ctx).renderContext,(local_528->m_ctx).shaderType,
                       (ShaderSpec *)local_d0);
  local_458 = (undefined1  [8])
              (local_4b8->in0).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start;
  auStack_450 = (undefined1  [8])
                (local_4b8->in1).
                super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_448._M_allocated_capacity =
       (size_type)
       (local_4b8->in2).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_448._8_8_ =
       (local_4b8->in3).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_248[0]._M_dataplus._M_p =
       (pointer)local_2a8.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_248[0]._M_string_length =
       (size_type)
       local_2a8.out1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  (*pSVar16->_vptr_ShaderExecutor[3])
            (pSVar16,((pPVar23->super_TestCase).super_TestNode.m_testCtx)->m_log);
  iVar11 = (*pSVar16->_vptr_ShaderExecutor[2])(pSVar16);
  if ((char)iVar11 != '\0') {
    (*pSVar16->_vptr_ShaderExecutor[5])(pSVar16);
    (*pSVar16->_vptr_ShaderExecutor[6])(pSVar16,uVar20 & 0xffffffff,local_458,local_248);
    (*pSVar16->_vptr_ShaderExecutor[1])(pSVar16);
    pVVar8 = local_520;
    local_458 = (undefined1  [8])((ulong)local_458 & 0xffffffffffffff00);
    auStack_450 = (undefined1  [8])0x7ff0000000000000;
    local_448._M_allocated_capacity = 0xfff0000000000000;
    local_248[0]._M_dataplus._M_p = local_248[0]._M_dataplus._M_p & 0xffffffffffffff00;
    local_248[0]._M_string_length = 0x7ff0000000000000;
    local_248[0].field_2._M_allocated_capacity = -INFINITY;
    local_4f8[0] = false;
    local_4f0 = INFINITY;
    local_4e8._M_allocated_capacity = 0xfff0000000000000;
    Environment::bind<float>
              ((Environment *)&local_278,
               (local_520->in0).
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr,
               (IVal *)local_458);
    Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
              ((Environment *)&local_278,
               (pVVar8->in1).
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
               .m_ptr,(IVal *)&local_518);
    Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
              ((Environment *)&local_278,
               (pVVar8->in2).
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
               .m_ptr,(IVal *)&local_4a8);
    Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
              ((Environment *)&local_278,
               (pVVar8->in3).
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
               .m_ptr,(IVal *)&local_488);
    Environment::bind<float>
              ((Environment *)&local_278,
               (pVVar8->out0).
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr,
               (IVal *)local_248);
    Environment::bind<int>
              ((Environment *)&local_278,
               (pVVar8->out1).
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<int>_>.m_ptr,
               (IVal *)local_4f8);
    local_468 = uVar20;
    if (pfVar3 == pfVar2) {
      local_4c0 = 0;
    }
    else {
      local_4b0 = &(local_528->m_ctx).floatFormat;
      local_460 = &local_528->m_status;
      local_2b0 = uVar20 + (uVar20 == 0);
      lVar22 = 0;
      uVar20 = 0;
      local_4c0 = 0;
      pPVar23 = local_528;
      do {
        local_4a8._0_8_ = local_4a8._0_8_ & 0xffffffffffffff00;
        local_4a8.m_lo = INFINITY;
        local_4a8.m_hi = -INFINITY;
        local_488._0_8_ = local_488._0_8_ & 0xffffffffffffff00;
        local_488.m_lo = INFINITY;
        local_488.m_hi = -INFINITY;
        if ((uVar20 & 0xfff) == 0) {
          tcu::TestContext::touchWatchdog((pPVar23->super_TestCase).super_TestNode.m_testCtx);
        }
        fVar1 = (local_4b8->in0).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start[uVar20];
        pp_Var7 = (_func_int **)(double)fVar1;
        bVar9 = NAN(fVar1);
        local_458[0] = bVar9;
        auStack_450 = (undefined1  [8])(_func_int **)0x7ff0000000000000;
        if (!bVar9) {
          auStack_450 = (undefined1  [8])pp_Var7;
        }
        local_448._M_allocated_capacity = (size_type)(_func_int **)0xfff0000000000000;
        if (!bVar9) {
          local_448._M_allocated_capacity = (size_type)pp_Var7;
        }
        tcu::FloatFormat::roundOut((Interval *)local_4f8,local_4b0,(Interval *)local_458,false);
        tcu::FloatFormat::convert((Interval *)local_248,local_4b0,(Interval *)local_4f8);
        pIVar17 = Environment::lookup<float>
                            ((Environment *)&local_278,
                             (local_520->in0).
                             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>
                             .m_ptr);
        pVVar8 = local_520;
        pIVar17->m_hi = (double)local_248[0].field_2._0_8_;
        *(pointer *)pIVar17 = local_248[0]._M_dataplus._M_p;
        pIVar17->m_lo = (double)local_248[0]._M_string_length;
        Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                  ((Environment *)&local_278,
                   (local_520->in1).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                   .m_ptr);
        Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                  ((Environment *)&local_278,
                   (pVVar8->in2).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                   .m_ptr);
        Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                  ((Environment *)&local_278,
                   (pVVar8->in3).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                   .m_ptr);
        local_430.basic.type = (pPVar23->m_ctx).precision;
        local_438 = local_4b0->m_maxValue;
        local_458 = *(undefined1 (*) [8])local_4b0;
        auStack_450 = *(undefined1 (*) [8])&local_4b0->m_fractionBits;
        local_448._M_allocated_capacity = *(undefined8 *)&local_4b0->m_hasInf;
        local_448._8_8_ = *(undefined8 *)&local_4b0->m_exactPrecision;
        local_420 = 0;
        local_430._8_8_ = &local_278;
        (*local_4c8->_vptr_Statement[3])(local_4c8,(MessageBuilder *)local_458);
        pVVar8 = local_520;
        x = Environment::lookup<int>
                      ((Environment *)&local_278,
                       (local_520->out1).
                       super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<int>_>.m_ptr
                      );
        tcu::FloatFormat::convert((Interval *)local_458,&local_2d8,x);
        local_488.m_hi = (double)local_448._M_allocated_capacity;
        local_488._0_8_ = local_458;
        local_488.m_lo = (double)auStack_450;
        iVar11 = local_2a8.out1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar20];
        local_48 = (_func_int **)auStack_450;
        uStack_40 = 0;
        local_58 = (double)local_448._M_allocated_capacity;
        uStack_50 = 0;
        local_458 = (undefined1  [8])(auStack_450 + 8);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_458,"Shader output 1 is outside acceptable range","");
        bVar9 = tcu::ResultCollector::check
                          (local_460,
                           (bool)(-((double)iVar11 <= local_58) &
                                  -((double)local_48 <= (double)iVar11) & 1),(string *)local_458);
        if (local_458 != (undefined1  [8])(auStack_450 + 8)) {
          operator_delete((void *)local_458,local_448._M_allocated_capacity + 1);
        }
        pIVar17 = Environment::lookup<float>
                            ((Environment *)&local_278,
                             (pVVar8->out0).
                             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>
                             .m_ptr);
        tcu::FloatFormat::convert((Interval *)local_458,&local_2d8,pIVar17);
        local_4a8.m_hi = (double)local_448._M_allocated_capacity;
        local_4a8._0_8_ = local_458;
        uVar12 = local_4a8._0_8_;
        local_4a8.m_lo = (double)auStack_450;
        fVar1 = local_2a8.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start[uVar20];
        dVar24 = (double)fVar1;
        dVar25 = dVar24;
        if (NAN(fVar1)) {
          dVar25 = INFINITY;
          dVar24 = -INFINITY;
        }
        IVar21 = (IVal)(dVar24 <= (double)local_448._M_allocated_capacity &&
                       (double)auStack_450 <= dVar25);
        if ((NAN(fVar1)) &&
           (dVar24 <= (double)local_448._M_allocated_capacity && (double)auStack_450 <= dVar25)) {
          local_4a8.m_hasNaN = local_458[0];
          IVar21 = (IVal)local_4a8.m_hasNaN;
        }
        local_458 = (undefined1  [8])(auStack_450 + 8);
        local_4a8._0_8_ = uVar12;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_458,"Shader output 0 is outside acceptable range","");
        bVar10 = tcu::ResultCollector::check(local_460,(bool)((byte)IVar21 & 1),(string *)local_458)
        ;
        if (local_458 != (undefined1  [8])(auStack_450 + 8)) {
          operator_delete((void *)local_458,local_448._M_allocated_capacity + 1);
        }
        pPVar23 = local_528;
        uVar18 = (int)local_4c0 + ((byte)~(bVar9 && bVar10) & 1);
        local_4c0 = (ulong)uVar18;
        if ((int)uVar18 < 0x65 && (!bVar9 || !bVar10)) {
          local_458 = (undefined1  [8])((local_528->super_TestCase).super_TestNode.m_testCtx)->m_log
          ;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_450);
          pcVar13 = "Failed";
          if (bVar9 && bVar10) {
            pcVar13 = "Passed";
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_450,pcVar13,6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_450," sample:\n",9);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_450,"\t",1);
          pVVar4 = (local_520->in0).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr;
          local_248[0]._M_dataplus._M_p = (pointer)&local_248[0].field_2;
          pcVar5 = (pVVar4->m_name)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_248,pcVar5,pcVar5 + (pVVar4->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)auStack_450,local_248[0]._M_dataplus._M_p,
                     local_248[0]._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_450," = ",3);
          valueToString<float>
                    ((string *)local_4f8,&local_2d8,
                     (float *)((long)(local_4b8->in0).
                                     super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                     super__Vector_impl_data._M_start + lVar22));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)auStack_450,(char *)CONCAT71(local_4f8._1_7_,local_4f8[0]),
                     (long)local_4f0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_450,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_4f8._1_7_,local_4f8[0]) != &local_4e8) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT71(local_4f8._1_7_,local_4f8[0]),
                            (ulong)(local_4e8._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_248[0]._M_dataplus._M_p != &local_248[0].field_2) {
            operator_delete(local_248[0]._M_dataplus._M_p,
                            local_248[0].field_2._M_allocated_capacity + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_450,"\t",1);
          pVVar4 = (local_520->out0).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr;
          local_248[0]._M_dataplus._M_p = (pointer)&local_248[0].field_2;
          pcVar5 = (pVVar4->m_name)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_248,pcVar5,pcVar5 + (pVVar4->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)auStack_450,local_248[0]._M_dataplus._M_p,
                     local_248[0]._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_450," = ",3);
          valueToString<float>
                    ((string *)local_4f8,&local_2d8,
                     (float *)((long)local_2a8.out0.
                                     super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                     super__Vector_impl_data._M_start + lVar22));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)auStack_450,(char *)CONCAT71(local_4f8._1_7_,local_4f8[0]),
                     (long)local_4f0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_450,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)auStack_450,"\tExpected range: ",0x11);
          intervalToString<float>(&local_518,&local_2d8,&local_4a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)auStack_450,local_518._M_dataplus._M_p,local_518._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_450,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_518._M_dataplus._M_p != &local_518.field_2) {
            operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_4f8._1_7_,local_4f8[0]) != &local_4e8) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT71(local_4f8._1_7_,local_4f8[0]),
                            (ulong)(local_4e8._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_248[0]._M_dataplus._M_p != &local_248[0].field_2) {
            operator_delete(local_248[0]._M_dataplus._M_p,
                            local_248[0].field_2._M_allocated_capacity + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_450,"\t",1);
          pVVar6 = (local_520->out1).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<int>_>.m_ptr;
          local_248[0]._M_dataplus._M_p = (pointer)&local_248[0].field_2;
          pcVar5 = (pVVar6->m_name)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_248,pcVar5,pcVar5 + (pVVar6->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)auStack_450,local_248[0]._M_dataplus._M_p,
                     local_248[0]._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_450," = ",3);
          valueToString<int>((string *)local_4f8,&local_2d8,
                             (int *)((long)local_2a8.out1.
                                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                           super__Vector_impl_data._M_start + lVar22));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)auStack_450,(char *)CONCAT71(local_4f8._1_7_,local_4f8[0]),
                     (long)local_4f0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_450,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)auStack_450,"\tExpected range: ",0x11);
          intervalToString<int>(&local_518,&local_2d8,&local_488);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)auStack_450,local_518._M_dataplus._M_p,local_518._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_450,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_518._M_dataplus._M_p != &local_518.field_2) {
            operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_4f8._1_7_,local_4f8[0]) != &local_4e8) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT71(local_4f8._1_7_,local_4f8[0]),
                            (ulong)(local_4e8._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_248[0]._M_dataplus._M_p != &local_248[0].field_2) {
            operator_delete(local_248[0]._M_dataplus._M_p,
                            local_248[0].field_2._M_allocated_capacity + 1);
          }
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_458,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_450);
          std::ios_base::~ios_base(local_3e0);
        }
        uVar20 = uVar20 + 1;
        lVar22 = lVar22 + 4;
      } while (local_2b0 != uVar20);
    }
    iVar11 = (int)local_4c0;
    if (100 < iVar11) {
      local_458 = (undefined1  [8])((local_528->super_TestCase).super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_450);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_450,"(Skipped ",9);
      std::ostream::operator<<((ostringstream *)auStack_450,iVar11 + -100);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_450," messages.)",0xb);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_458,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_450);
      std::ios_base::~ios_base(local_3e0);
    }
    if (iVar11 == 0) {
      local_458 = (undefined1  [8])((local_528->super_TestCase).super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_450);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_450,"All ",4);
      std::ostream::_M_insert<unsigned_long>((ulong)auStack_450);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)auStack_450," inputs passed.",0xf);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_458,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      local_458 = (undefined1  [8])((local_528->super_TestCase).super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_450);
      std::ostream::operator<<((ostringstream *)auStack_450,iVar11);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_450,"/",1);
      std::ostream::_M_insert<unsigned_long>((ulong)auStack_450);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)auStack_450," inputs failed.",0xf);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_458,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_450);
    std::ios_base::~ios_base(local_3e0);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
    ::~_Rb_tree(&local_278);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_p != &local_68) {
      operator_delete(local_78._M_p,
                      CONCAT71(local_68._M_allocated_capacity._1_7_,local_68._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_p != &local_88) {
      operator_delete(local_98._M_p,
                      CONCAT71(local_88._M_allocated_capacity._1_7_,local_88._M_local_buf[0]) + 1);
    }
    std::
    vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>::
    ~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_d0 + 0x20));
    std::
    vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>::
    ~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_d0 + 8));
    if (local_2a8.out1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_2a8.out1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_2a8.out1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_2a8.out1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_2a8.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2a8.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_2a8.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl
                            .super__Vector_impl_data._M_end_of_storage -
                      (long)local_2a8.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl
                            .super__Vector_impl_data._M_start);
    }
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Shader compilation failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsBuiltinPrecisionTests.cpp"
             ,0x11d4);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void PrecisionCase::testStatement (const Variables<In, Out>&	variables,
								   const Inputs<In>&			inputs,
								   const Statement&				stmt)
{
	using namespace ShaderExecUtil;

	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	const FloatFormat&	fmt			= getFormat();
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	ShaderSpec			spec;
	const FloatFormat	highpFmt	= m_ctx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	// Print out the statement and its definitions
	log() << TestLog::Message << "Statement: " << stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		stmt.getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			log() << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	// Initialize ShaderSpec from precision, variables and statement.
	{
		ostringstream os;
		os << "precision " << glu::getPrecisionName(m_ctx.precision) << " float;\n";
		spec.globalDeclarations = os.str();
	}

	spec.version = getContextTypeGLSLVersion(getRenderContext().getType());

	if (!m_extension.empty())
		spec.globalDeclarations = "#extension " + m_extension + " : require\n";

	spec.inputs.resize(inCount);

	switch (inCount)
	{
		case 4: spec.inputs[3] = makeSymbol(*variables.in3);
		case 3:	spec.inputs[2] = makeSymbol(*variables.in2);
		case 2:	spec.inputs[1] = makeSymbol(*variables.in1);
		case 1:	spec.inputs[0] = makeSymbol(*variables.in0);
		default: break;
	}

	spec.outputs.resize(outCount);

	switch (outCount)
	{
		case 2:	spec.outputs[1] = makeSymbol(*variables.out1);
		case 1:	spec.outputs[0] = makeSymbol(*variables.out0);
		default: break;
	}

	spec.source = de::toString(stmt);

	// Run the shader with inputs.
	{
		UniquePtr<ShaderExecutor>	executor		(createExecutor(getRenderContext(),
																	m_ctx.shaderType,
																	spec));
		const void*					inputArr[]		=
		{
			&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
		};
		void*						outputArr[]		=
		{
			&outputs.out0.front(), &outputs.out1.front(),
		};

		executor->log(log());
		if (!executor->isOk())
			TCU_FAIL("Shader compilation failed");

		executor->useProgram();
		executor->execute(int(numValues), inputArr, outputArr);
	}

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*variables.in0, in0);
		env.bind(*variables.in1, in1);
		env.bind(*variables.in2, in2);
		env.bind(*variables.in3, in3);
		env.bind(*variables.out0, reference0);
		env.bind(*variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		if (valueNdx % (size_t)TOUCH_WATCHDOG_VALUE_FREQUENCY == 0)
			m_testCtx.touchWatchdog();

		env.lookup(*variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_ctx.precision, env);
			stmt.execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*variables.out1));
				if (!m_status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*variables.out0));
				if (!m_status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= log().message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		log() << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		log() << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		log() << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}
}